

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int CVmObjDate::common_parseDate(vm_val_t *retval,uint *oargc,multicaldate_t *cal)

{
  int32_t *piVar1;
  CVmObjPageEntry *pCVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int32_t reftime_00;
  int32_t refday_00;
  int iVar6;
  uint uVar7;
  vm_obj_id_t vVar8;
  CVmTimeZone *reftz;
  int fi;
  long lVar9;
  uint argc;
  date_parse_string *fmtlist;
  CVmObjPageEntry *pCVar10;
  int fmt_match_cnt;
  vm_val_t ele;
  int32_t daytime;
  int32_t dayno;
  int32_t reftime;
  int32_t refday;
  vm_val_t *local_2b0;
  char *local_2a8;
  CVmDateLocale lc;
  date_parse_result local_290;
  date_parse_string fmt_match [20];
  
  if (oargc == (uint *)0x0) {
    argc = 0;
  }
  else {
    argc = *oargc;
  }
  if ((common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc == '\0') &&
     (iVar6 = __cxa_guard_acquire(&common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc),
     iVar6 != 0)) {
    common_parseDate::desc.min_argc_ = 1;
    common_parseDate::desc.opt_argc_ = 3;
    common_parseDate::desc.varargs_ = 0;
    __cxa_guard_release(&common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc);
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&common_parseDate::desc);
  if (iVar6 != 0) {
    return 1;
  }
  CVmDateLocale::CVmDateLocale(&lc);
  local_2a8 = vm_val_t::get_as_string(sp_ + -1);
  if (local_2a8 == (char *)0x0) {
    err_throw(0x902);
  }
  if (argc < 2) {
    local_2b0 = (vm_val_t *)0x0;
  }
  else {
    local_2b0 = (vm_val_t *)0x0;
    if (sp_[-2].typ != VM_NIL) {
      local_2b0 = sp_ + -2;
    }
    if ((argc != 2) && (sp_[-3].typ != VM_NIL)) {
      if ((sp_[-3].typ != VM_OBJ) ||
         (uVar7 = sp_[-3].val.obj & 0xfff,
         iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc][uVar7].ptr_ + 8
                             ))(G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] + uVar7,metaclass_reg_)
         , iVar6 == 0)) {
LAB_0027e7c2:
        err_throw(0x900);
      }
      if (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] == (CVmObjPageEntry *)0x0) goto LAB_0027e7c2;
      piVar1 = *(int32_t **)
                ((long)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc][sp_[-3].val.obj & 0xfff].ptr_ +
                8);
      refday = *piVar1;
      reftime = piVar1[1];
      goto LAB_0027e3cd;
    }
  }
  caldate_t::now(&refday,&reftime);
LAB_0027e3cd:
  refday_00 = refday;
  reftime_00 = reftime;
  reftz = get_tz_arg(3,argc);
  memset(&local_290.pera,0,0xd0);
  local_290.era = 0;
  local_290.yy = -0x80000000;
  local_290.mm = -0x80000000;
  local_290.dd = -0x80000000;
  local_290.mi = -0x80000000;
  local_290.ss = -0x80000000;
  local_290.ms = -0x80000000;
  local_290.tzofs = -0x80000000;
  local_290.w = -0x80000000;
  local_290.yy_needs_century = 0;
  local_290.ampm = 0;
  local_290.hh = -0x80000000;
  local_290.tz = (CVmTimeZone *)0x0;
  fmtlist = fmt_match;
  local_290.cal = cal;
  memset(fmtlist,0,0x140);
  fmt_match_cnt = 0x14;
  iVar6 = parse_date_string(&dayno,&daytime,local_2a8,local_2b0,&lc,cal,refday_00,reftime_00,reftz,
                            &local_290,fmtlist,&fmt_match_cnt);
  if (iVar6 == 0) {
    retval->typ = VM_NIL;
  }
  else {
    vVar8 = CVmObjList::create(0,5);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    pCVar10 = G_obj_table_X.pages_[(retval->val).obj >> 0xc] + ((retval->val).obj & 0xfff);
    CVmObjList::cons_clear((CVmObjList *)pCVar10);
    ele.val.obj = create(0,dayno,daytime);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)pCVar10,0,&ele);
    ele.typ = VM_NIL;
    if (local_290.tz != reftz) {
      ele.val.obj = CVmObjTimeZone::create(local_290.tz);
      ele.typ = VM_OBJ;
    }
    CVmObjList::cons_set_element((CVmObjList *)pCVar10,1,&ele);
    ele.val.intval = local_290.tzofs / 1000;
    ele.typ = VM_INT;
    CVmObjList::cons_set_element((CVmObjList *)pCVar10,2,&ele);
    ele.val.obj = CVmObjList::create(0,(long)fmt_match_cnt);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)pCVar10,3,&ele);
    uVar7 = ele.val.obj & 0xfff;
    pCVar2 = G_obj_table_X.pages_[ele.val.obj >> 0xc];
    CVmObjList::cons_clear((CVmObjList *)(pCVar2 + uVar7));
    for (lVar9 = 0; lVar9 < fmt_match_cnt; lVar9 = lVar9 + 1) {
      enlist_str((CVmObjList *)(pCVar2 + uVar7),(int)lVar9,fmtlist);
      fmtlist = fmtlist + 1;
    }
    ele.val.obj = CVmObjList::create(0,0xd);
    ele.typ = VM_OBJ;
    CVmObjList::cons_set_element((CVmObjList *)pCVar10,4,&ele);
    pCVar10 = G_obj_table_X.pages_[ele.val.obj >> 0xc] + (ele.val.obj & 0xfff);
    CVmObjList::cons_clear((CVmObjList *)pCVar10);
    enlist_str((CVmObjList *)pCVar10,0,&local_290.pera);
    enlist_str((CVmObjList *)pCVar10,1,&local_290.pyy);
    enlist_str((CVmObjList *)pCVar10,2,&local_290.pmm);
    enlist_str((CVmObjList *)pCVar10,3,&local_290.pdd);
    enlist_str((CVmObjList *)pCVar10,4,&local_290.pdoy);
    enlist_str((CVmObjList *)pCVar10,5,&local_290.pw);
    enlist_str((CVmObjList *)pCVar10,6,&local_290.pampm);
    enlist_str((CVmObjList *)pCVar10,7,&local_290.phh);
    enlist_str((CVmObjList *)pCVar10,8,&local_290.pmi);
    enlist_str((CVmObjList *)pCVar10,9,&local_290.pss);
    enlist_str((CVmObjList *)pCVar10,10,&local_290.pms);
    enlist_str((CVmObjList *)pCVar10,0xb,&local_290.punix);
    enlist_str((CVmObjList *)pCVar10,0xc,&local_290.ptz);
    sp_ = sp_ + -1;
  }
  sp_ = sp_ + -(long)(int)argc;
  return 1;
}

Assistant:

int CVmObjDate::common_parseDate(VMG_ vm_val_t *retval, uint *oargc,
                                 multicaldate_t *cal)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3, FALSE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up a locale state interface */
    CVmDateLocale lc Pvmg0_P;

    /* retrieve the string to parse */
    const char *src = G_stk->get(0)->get_as_string(vmg0_);
    if (src == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the format string/list argument, if present */
    const vm_val_t *custom = 0;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        custom = G_stk->get(1);

    /* retrieve the reference date, if present */
    int32_t refday, reftime;
    if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
    {
        /* get the reference date */
        CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
        if (refdate == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get its contents */
        refday = refdate->get_ext()->dayno;
        reftime = refdate->get_ext()->daytime;
    }
    else
    {
        /* no reference date argument - get the current date and time */
        caldate_t::now(refday, reftime);
    }

    /* retrieve the reference time zone, if present */
    CVmTimeZone *reftz = get_tz_arg(vmg_ 3, argc);

    /* parse the date */
    int32_t dayno, daytime;
    date_parse_result result(cal);
    date_parse_string fmt_match[20];
    int fmt_match_cnt = countof(fmt_match);
    if (parse_date_string(vmg_ dayno, daytime, src, custom, &lc,
                          cal, refday, reftime, reftz, &result,
                          fmt_match, &fmt_match_cnt))
    {
        /* create the return list */
        retval->set_obj(CVmObjList::create(vmg_ FALSE, 5));
        G_stk->push(retval);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
        lst->cons_clear();

        /* element [1] is the return date */
        vm_val_t ele;
        ele.set_obj(CVmObjDate::create(vmg_ FALSE, dayno, daytime));
        lst->cons_set_element(0, &ele);

        /* [2] is the TimeZone object, if applicable */
        ele.set_nil();
        if (result.tz != reftz)
            ele.set_obj(CVmObjTimeZone::create(vmg_ result.tz));
        lst->cons_set_element(1, &ele);

        /* [3] is the fixed timezone offset in seconds, if applicable */
        ele.set_nil();
        if (result.has_tzofs())
            ele.set_int(result.tzofs / 1000);
        lst->cons_set_element(2, &ele);

        /* [4] next is the format string matched */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, fmt_match_cnt));
        lst->cons_set_element(3, &ele);
        CVmObjList *flst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        flst->cons_clear();

        /* populate the format string list */
        for (int fi = 0 ; fi < fmt_match_cnt ; ++fi)
            enlist_str(vmg_ flst, fi, fmt_match[fi]);

        /* [5] is a sublist with the source substrings */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, 13));
        lst->cons_set_element(4, &ele);
        CVmObjList *slst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        slst->cons_clear();

        /* now add the date component source strings */
        enlist_str(vmg_ slst, 0, result.pera);
        enlist_str(vmg_ slst, 1, result.pyy);
        enlist_str(vmg_ slst, 2, result.pmm);
        enlist_str(vmg_ slst, 3, result.pdd);
        enlist_str(vmg_ slst, 4, result.pdoy);
        enlist_str(vmg_ slst, 5, result.pw);
        enlist_str(vmg_ slst, 6, result.pampm);
        enlist_str(vmg_ slst, 7, result.phh);
        enlist_str(vmg_ slst, 8, result.pmi);
        enlist_str(vmg_ slst, 9, result.pss);
        enlist_str(vmg_ slst, 10, result.pms);
        enlist_str(vmg_ slst, 11, result.punix);
        enlist_str(vmg_ slst, 12, result.ptz);

        /* done with the list gc protection */
        G_stk->discard();
    }
    else
    {
        /* return nil */
        retval->set_nil();
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}